

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O1

void diy::
     reduce<diy::detail::KDTreeSamplingPartition<Block,SimplePoint<2u>>,diy::detail::KDTreePartners,diy::detail::ReduceNeverSkip>
               (Master *master,Assigner *assigner,KDTreePartners *partners,
               KDTreeSamplingPartition<Block,_SimplePoint<2U>_> *reduce,ReduceNeverSkip *skip)

{
  offset_in_Block_to_vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_> oVar1;
  bool bVar2;
  mapped_type *this;
  mapped_type *this_00;
  int round_;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> incoming_gids;
  _Any_data local_3a8;
  code *local_398;
  code *pcStack_390;
  _Any_data local_388;
  code *local_378;
  code *pcStack_370;
  int local_35c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_358;
  KDTreeSamplingPartition<Block,_SimplePoint<2U>_> *local_350;
  Assigner *local_348;
  ulong local_340;
  int *local_338;
  IncomingRoundMap *local_330;
  _Any_data local_328;
  code *local_318;
  code *pcStack_310;
  _Any_data local_308;
  code *local_2f8;
  code *pcStack_2f0;
  _Any_data local_2e8;
  code *local_2d8;
  code *pcStack_2d0;
  ReductionFunctor<Block,_diy::detail::KDTreePartners> local_2c8;
  
  local_350 = reduce;
  local_348 = assigner;
  local_358 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_358->_M_use_count = 1;
  local_358->_M_weak_count = 1;
  local_358->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159098;
  local_35c = master->expected_;
  if ((partners->rounds_).
      super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (partners->rounds_).
      super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
  }
  else {
    local_330 = &master->incoming_;
    local_338 = &master->exchange_round_;
    uVar5 = 0;
    do {
      local_398 = (code *)0x0;
      pcStack_390 = (code *)0x0;
      local_3a8._M_unused._M_object = (void *)0x0;
      local_3a8._8_8_ = 0;
      local_3a8._M_unused._M_object = operator_new(0x18);
      *(size_t *)((long)local_3a8._M_unused._0_8_ + 0x10) = local_350->samples_;
      oVar1 = local_350->points_;
      *(undefined8 *)local_3a8._M_unused._0_8_ = *(undefined8 *)local_350;
      *(offset_in_Block_to_vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_> *)
       ((long)local_3a8._M_unused._0_8_ + 8) = oVar1;
      pcStack_390 = std::
                    _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&),_diy::detail::KDTreeSamplingPartition<Block,_SimplePoint<2U>_>_>
                    ::_M_invoke;
      local_398 = std::
                  _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&),_diy::detail::KDTreeSamplingPartition<Block,_SimplePoint<2U>_>_>
                  ::_M_manager;
      round_ = (int)uVar5;
      detail::ReductionFunctor<Block,_diy::detail::KDTreePartners>::ReductionFunctor
                (&local_2c8,round_,(Callback *)&local_3a8,partners,local_348);
      local_378 = (code *)0x0;
      pcStack_370 = (code *)0x0;
      local_388._M_unused._M_object = (void *)0x0;
      local_388._8_8_ = 0;
      local_388._M_unused._M_object = operator_new(0x18);
      *(int *)local_388._M_unused._0_8_ = round_;
      *(KDTreePartners **)((long)local_388._M_unused._0_8_ + 8) = partners;
      pcStack_370 = std::
                    _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip>_>
                    ::_M_invoke;
      local_378 = std::
                  _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip>_>
                  ::_M_manager;
      Master::foreach<diy::detail::ReductionFunctor<Block,diy::detail::KDTreePartners>>
                (master,&local_2c8,(Skip *)&local_388);
      if (local_378 != (code *)0x0) {
        (*local_378)(&local_388,&local_388,__destroy_functor);
      }
      detail::KDTreePartners::~KDTreePartners(&local_2c8.partners);
      if (local_2c8.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_2c8.reduce.super__Function_base._M_manager)
                  ((_Any_data *)&local_2c8.reduce,(_Any_data *)&local_2c8.reduce,__destroy_functor);
      }
      if (local_398 != (code *)0x0) {
        (*local_398)(&local_3a8,&local_3a8,__destroy_functor);
      }
      Master::execute(master);
      local_340 = uVar5;
      if ((int)((ulong)((long)(master->blocks_).elements_.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(master->blocks_).elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) == 0) {
        iVar4 = 0;
      }
      else {
        uVar3 = 0;
        iVar4 = 0;
        do {
          bVar2 = detail::KDTreePartners::active
                            (partners,round_ + 1,
                             (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)uVar3],master);
          if (bVar2) {
            local_2c8._0_8_ = (pointer)0x0;
            local_2c8.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
            local_2c8.reduce.super__Function_base._M_functor._8_8_ = 0;
            detail::KDTreePartners::incoming
                      (partners,round_ + 1,
                       (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar3],
                       (vector<int,_std::allocator<int>_> *)&local_2c8,master);
            uVar5 = (long)local_2c8.reduce.super__Function_base._M_functor._M_unused._0_8_ -
                    local_2c8._0_8_;
            local_3a8._0_4_ =
                 (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar3];
            this = std::
                   map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
                   ::operator[](local_330,local_338);
            this_00 = std::
                      map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                      ::operator[](&this->map,(key_type *)local_3a8._M_pod_data);
            concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
            ::clear(this_00);
            if ((pointer)local_2c8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_2c8._0_8_,
                              local_2c8.reduce.super__Function_base._M_functor._8_8_ -
                              local_2c8._0_8_);
            }
            iVar4 = iVar4 + (int)(uVar5 >> 2);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < (uint)((ulong)((long)(master->blocks_).elements_.
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(master->blocks_).elements_.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      master->expected_ = iVar4;
      local_328._M_unused._M_object = (void *)0x0;
      local_328._8_8_ = 0;
      pcStack_310 = std::
                    _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                    ::_M_invoke;
      local_318 = std::
                  _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                  ::_M_manager;
      local_308._M_unused._M_object = (void *)0x0;
      local_308._8_8_ = 0;
      pcStack_2f0 = std::
                    _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                    ::_M_invoke;
      local_2f8 = std::
                  _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                  ::_M_manager;
      local_2e8._M_unused._M_object = (void *)0x0;
      local_2e8._8_8_ = 0;
      pcStack_2d0 = std::
                    _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                    ::_M_invoke;
      local_2d8 = std::
                  _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                  ::_M_manager;
      Master::flush(master,false,(MemoryManagement *)&local_328);
      uVar5 = local_340;
      if (local_2d8 != (code *)0x0) {
        (*local_2d8)(&local_2e8,&local_2e8,__destroy_functor);
      }
      if (local_2f8 != (code *)0x0) {
        (*local_2f8)(&local_308,&local_308,__destroy_functor);
      }
      if (local_318 != (code *)0x0) {
        (*local_318)(&local_328,&local_328,__destroy_functor);
      }
      uVar3 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar3;
    } while (uVar5 < (ulong)((long)(partners->rounds_).
                                   super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(partners->rounds_).
                                   super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_398 = (code *)0x0;
  pcStack_390 = (code *)0x0;
  local_3a8._M_unused._M_object = (void *)0x0;
  local_3a8._8_8_ = 0;
  local_3a8._M_unused._M_object = operator_new(0x18);
  *(size_t *)((long)local_3a8._M_unused._0_8_ + 0x10) = local_350->samples_;
  oVar1 = local_350->points_;
  *(undefined8 *)local_3a8._M_unused._0_8_ = *(undefined8 *)local_350;
  *(offset_in_Block_to_vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_> *)
   ((long)local_3a8._M_unused._0_8_ + 8) = oVar1;
  pcStack_390 = std::
                _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&),_diy::detail::KDTreeSamplingPartition<Block,_SimplePoint<2U>_>_>
                ::_M_invoke;
  local_398 = std::
              _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&),_diy::detail::KDTreeSamplingPartition<Block,_SimplePoint<2U>_>_>
              ::_M_manager;
  detail::ReductionFunctor<Block,_diy::detail::KDTreePartners>::ReductionFunctor
            (&local_2c8,uVar3,(Callback *)&local_3a8,partners,local_348);
  local_378 = (code *)0x0;
  pcStack_370 = (code *)0x0;
  local_388._M_unused._M_object = (void *)0x0;
  local_388._8_8_ = 0;
  local_388._M_unused._M_object = operator_new(0x18);
  *(uint *)local_388._M_unused._0_8_ = uVar3;
  *(KDTreePartners **)((long)local_388._M_unused._0_8_ + 8) = partners;
  pcStack_370 = std::
                _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip>_>
                ::_M_invoke;
  local_378 = std::
              _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip>_>
              ::_M_manager;
  Master::foreach<diy::detail::ReductionFunctor<Block,diy::detail::KDTreePartners>>
            (master,&local_2c8,(Skip *)&local_388);
  if (local_378 != (code *)0x0) {
    (*local_378)(&local_388,&local_388,__destroy_functor);
  }
  detail::KDTreePartners::~KDTreePartners(&local_2c8.partners);
  if (local_2c8.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_2c8.reduce.super__Function_base._M_manager)
              ((_Any_data *)&local_2c8.reduce,(_Any_data *)&local_2c8.reduce,__destroy_functor);
  }
  if (local_398 != (code *)0x0) {
    (*local_398)(&local_3a8,&local_3a8,__destroy_functor);
  }
  master->expected_ = local_35c;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}